

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

void Gia_ManDupFadd(Gia_Man_t *pNew,Gia_Man_t *p,Vec_Int_t *vChain,Vec_Int_t *vFadds,Vec_Int_t *vMap
                   ,Vec_Wec_t *vChains,Vec_Int_t *vMap2Chain,Vec_Int_t *vTruths)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  uint local_8c;
  uint local_68;
  uint local_64;
  int iMajTruth;
  int iXorTruth;
  Gia_Obj_t *pObj;
  int local_50;
  int pLits [3];
  int iCiLit;
  int iFadd;
  int k;
  int i;
  Vec_Wec_t *vChains_local;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vFadds_local;
  Vec_Int_t *vChain_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  pLits[2] = -1;
  for (iFadd = 0; iVar1 = Vec_IntSize(vChain), iFadd < iVar1; iFadd = iFadd + 1) {
    pLits[2] = Vec_IntEntry(vChain,iFadd);
    for (iCiLit = 0; iCiLit < 3; iCiLit = iCiLit + 1) {
      if ((iFadd == 0) || (iCiLit != 0)) {
        iVar1 = Vec_IntEntry(vFadds,pLits[2] * 5 + iCiLit);
        pGVar4 = Gia_ManObj(p,iVar1);
        Gia_ManDupWithFaddBoxes_rec(pNew,p,pGVar4,vFadds,vMap,vChains,vMap2Chain,vTruths);
      }
    }
  }
  pLits[1] = 0;
  iFadd = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vChain);
    iVar1 = pLits[2];
    if (iVar2 <= iFadd) {
      iVar2 = Vec_IntEntryLast(vChain);
      if (iVar1 == iVar2) {
        iVar1 = Vec_IntEntry(vFadds,pLits[2] * 5 + 4);
        pGVar4 = Gia_ManObj(p,iVar1);
        pGVar4->Value = pLits[1];
        return;
      }
      __assert_fail("iFadd == Vec_IntEntryLast(vChain)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                    ,0x2fd,
                    "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    pLits[2] = Vec_IntEntry(vChain,iFadd);
    local_64 = Vec_IntEntry(vTruths,pLits[2] << 1);
    local_68 = Vec_IntEntry(vTruths,pLits[2] * 2 + 1);
    for (iCiLit = 0; iCiLit < 3; iCiLit = iCiLit + 1) {
      iVar1 = Vec_IntEntry(vFadds,pLits[2] * 5 + iCiLit);
      pGVar4 = Gia_ManObj(p,iVar1);
      if ((iCiLit == 0) && (pLits[1] != 0)) {
        local_8c = pLits[1];
      }
      else {
        local_8c = pGVar4->Value;
      }
      *(uint *)((long)&pObj + (long)iCiLit * 4 + 4) = local_8c;
      if (*(int *)((long)&pObj + (long)iCiLit * 4 + 4) < 0) {
        __assert_fail("pLits[k] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                      ,0x2d6,
                      "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
    }
    if (local_68 == 0x4d) {
      pObj._4_4_ = Abc_LitNot(pObj._4_4_);
      local_68 = 0x8e;
      local_64 = (local_64 ^ 0xffffffff) & 0xff;
    }
    else if (local_68 == 0xd4) {
      pObj._4_4_ = Abc_LitNot(pObj._4_4_);
      local_68 = 0xe8;
      local_64 = (local_64 ^ 0xffffffff) & 0xff;
    }
    else if (local_68 == 0x2b) {
      local_50 = Abc_LitNot(local_50);
      local_68 = 0x8e;
      local_64 = (local_64 ^ 0xffffffff) & 0xff;
    }
    else if (local_68 == 0xb2) {
      local_50 = Abc_LitNot(local_50);
      local_68 = 0xe8;
      local_64 = (local_64 ^ 0xffffffff) & 0xff;
    }
    if (local_68 == 0x8e) {
      pLits[0] = Abc_LitNot(pLits[0]);
      local_68 = 0xe8;
      local_64 = (local_64 ^ 0xffffffff) & 0xff;
    }
    else if (local_68 == 0x71) {
      pLits[0] = Abc_LitNot(pLits[0]);
      local_68 = 0x17;
      local_64 = (local_64 ^ 0xffffffff) & 0xff;
    }
    else if ((local_68 != 0xe8) && (local_68 != 0x17)) {
      __assert_fail("iMajTruth == 0xE8 || iMajTruth == 0x17",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                    ,0x2e7,
                    "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Abc_LitIsCompl(pObj._4_4_);
    if (iVar1 != 0) {
      for (iCiLit = 0; iCiLit < 3; iCiLit = iCiLit + 1) {
        iVar1 = Abc_LitNot(*(int *)((long)&pObj + (long)iCiLit * 4 + 4));
        *(int *)((long)&pObj + (long)iCiLit * 4 + 4) = iVar1;
      }
      local_64 = (local_64 ^ 0xffffffff) & 0xff;
      local_68 = (local_68 ^ 0xffffffff) & 0xff;
    }
    iVar1 = Abc_LitIsCompl(pObj._4_4_);
    if (iVar1 != 0) break;
    for (iCiLit = 0; iCiLit < 3; iCiLit = iCiLit + 1) {
      Gia_ManAppendCo(pNew,*(int *)((long)&pObj + (long)iCiLit * 4 + 4));
    }
    if ((local_64 != 0x96) && (local_64 != 0x69)) {
      __assert_fail("iXorTruth == 0x96 || iXorTruth == 0x69",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                    ,0x2f5,
                    "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Vec_IntEntry(vFadds,pLits[2] * 5 + 3);
    pGVar4 = Gia_ManObj(p,iVar1);
    iVar1 = Gia_ManAppendCi(pNew);
    uVar3 = Abc_LitNotCond(iVar1,(uint)(local_64 == 0x69));
    pGVar4->Value = uVar3;
    if ((local_68 != 0xe8) && (local_68 != 0x17)) {
      __assert_fail("iMajTruth == 0xE8 || iMajTruth == 0x17",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                    ,0x2f9,
                    "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar1 = Gia_ManAppendCi(pNew);
    pLits[1] = Abc_LitNotCond(iVar1,(uint)(local_68 == 0x17));
    iFadd = iFadd + 1;
  }
  __assert_fail("!Abc_LitIsCompl(pLits[0])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                ,0x2f1,
                "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

void Gia_ManDupFadd( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Int_t * vChain, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains, Vec_Int_t * vMap2Chain, Vec_Int_t * vTruths )
{
    extern void Gia_ManDupWithFaddBoxes_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains, Vec_Int_t * vMap2Chain, Vec_Int_t * vTruths );
    int i, k, iFadd = -1, iCiLit, pLits[3];
    Gia_Obj_t * pObj;
    // construct FADD inputs
    Vec_IntForEachEntry( vChain, iFadd, i )
        for ( k = 0; k < 3; k++ )
        {
            if ( i && !k ) continue;
            pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+k) );
            Gia_ManDupWithFaddBoxes_rec( pNew, p, pObj, vFadds, vMap, vChains, vMap2Chain, vTruths );
        }
    // construct boxes
    iCiLit = 0;
    Vec_IntForEachEntry( vChain, iFadd, i )
    {
        int iXorTruth = Vec_IntEntry( vTruths, 2*iFadd+0 );
        int iMajTruth = Vec_IntEntry( vTruths, 2*iFadd+1 );
        for ( k = 0; k < 3; k++ )
        {
            pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+k) );
            pLits[k] = (!k && iCiLit) ? iCiLit : pObj->Value;
            assert( pLits[k] >= 0 );
        }
        // normalize truth table
        //    if ( Truth == 0xE8 || Truth == 0xD4 || Truth == 0xB2 || Truth == 0x71 ||
        //         Truth == 0x17 || Truth == 0x2B || Truth == 0x4D || Truth == 0x8E )
        if ( iMajTruth == 0x4D )
            pLits[0] = Abc_LitNot(pLits[0]), iMajTruth = 0x8E, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0xD4 )
            pLits[0] = Abc_LitNot(pLits[0]), iMajTruth = 0xE8, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0x2B )
            pLits[1] = Abc_LitNot(pLits[1]), iMajTruth = 0x8E, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0xB2 )
            pLits[1] = Abc_LitNot(pLits[1]), iMajTruth = 0xE8, iXorTruth = 0xFF & ~iXorTruth;
        if ( iMajTruth == 0x8E )
            pLits[2] = Abc_LitNot(pLits[2]), iMajTruth = 0xE8, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0x71 )
            pLits[2] = Abc_LitNot(pLits[2]), iMajTruth = 0x17, iXorTruth = 0xFF & ~iXorTruth;
        else assert( iMajTruth == 0xE8 || iMajTruth == 0x17 );
        // normalize carry-in
        if ( Abc_LitIsCompl(pLits[0]) )
        {
            for ( k = 0; k < 3; k++ )
                pLits[k] = Abc_LitNot(pLits[k]);
            iXorTruth = 0xFF & ~iXorTruth;
            iMajTruth = 0xFF & ~iMajTruth;
        }
        // add COs
        assert( !Abc_LitIsCompl(pLits[0]) );
        for ( k = 0; k < 3; k++ )
            Gia_ManAppendCo( pNew, pLits[k] );
        // create CI
        assert( iXorTruth == 0x96 || iXorTruth == 0x69 );
        pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+3) );
        pObj->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), (int)(iXorTruth == 0x69) );
        // create CI
        assert( iMajTruth == 0xE8 || iMajTruth == 0x17 );
        iCiLit = Abc_LitNotCond( Gia_ManAppendCi(pNew), (int)(iMajTruth == 0x17) );
    }   
    // assign carry out
    assert( iFadd == Vec_IntEntryLast(vChain) );
    pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+4) );
    pObj->Value = iCiLit;
}